

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O3

int __thiscall
QTextMarkdownImporter::cbText(QTextMarkdownImporter *this,int textType,char *text,uint size)

{
  QString *html;
  QTextImageFormat *this_00;
  char *pcVar1;
  QArrayData *pQVar2;
  qreal qVar3;
  undefined1 *puVar4;
  int *piVar5;
  QBasicAtomicInt *pQVar6;
  Data *pDVar7;
  QSharedDataPointer<QTextFormatPrivate> QVar8;
  undefined8 uVar9;
  Data *pDVar10;
  qsizetype qVar11;
  char cVar12;
  bool bVar13;
  int iVar14;
  storage_type *psVar15;
  iterator iVar16;
  QTextList *pQVar17;
  QChar QVar18;
  char16_t *pcVar19;
  QArrayData *pQVar20;
  long in_FS_OFFSET;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QLatin1String QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QString local_118;
  QString local_f8;
  QSharedDataPointer<QTextCursorPrivate> local_d8;
  QDebug local_d0;
  QString local_c8;
  QTextFormat local_a8;
  undefined1 local_98 [16];
  QString local_88;
  anon_union_24_3_e3d07ef4_for_data local_68;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_needsInsertBlock == true) {
    insertBlock(this);
  }
  if (cbText(int,char_const*,unsigned_int)::openingBracket == '\0') {
    cbText();
  }
  if (cbText(int,char_const*,unsigned_int)::closingBracket == '\0') {
    cbText();
  }
  psVar15 = (storage_type *)0x0;
  if (0 < (int)size) {
    psVar15 = (storage_type *)(ulong)size;
  }
  if (text == (char *)0x0) {
    psVar15 = (storage_type *)0x0;
  }
  local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (text != (char *)0x0 && (int)size < 0) {
    psVar15 = (storage_type *)strlen(text);
  }
  QVar21.m_data = psVar15;
  QVar21.m_size = (qsizetype)&local_c8;
  QString::fromUtf8(QVar21);
  pQVar2 = &(local_c8.d.d)->super_QArrayData;
  switch(textType) {
  case 0:
    if (this->m_htmlTagDepth == 0) goto switchD_005c3ca2_caseD_5;
    QString::append((QString *)&this->m_htmlAccumulator);
    pQVar20 = &(local_c8.d.d)->super_QArrayData;
    break;
  case 1:
    QVar18.ucs = L'�';
    goto LAB_005c3ecf;
  case 2:
    QVar18.ucs = L'\n';
    goto LAB_005c3ecf;
  case 3:
    QVar18.ucs = L' ';
LAB_005c3ecf:
    QString::QString((QString *)&local_68,QVar18);
    pQVar2 = (QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_);
    pcVar19 = (char16_t *)CONCAT44(local_68._12_4_,local_68._8_4_);
    local_68._0_4_ = SUB84(local_c8.d.d,0);
    local_68._4_4_ = (undefined4)((ulong)local_c8.d.d >> 0x20);
    puVar4 = (undefined1 *)CONCAT44(local_68._20_4_,local_68._16_4_);
    local_68._8_4_ = SUB84(local_c8.d.ptr,0);
    local_68._12_4_ = (undefined4)((ulong)local_c8.d.ptr >> 0x20);
    local_68._16_4_ = (undefined4)local_c8.d.size;
    local_68._20_4_ = (undefined4)((ulong)local_c8.d.size >> 0x20);
    local_c8.d.ptr = pcVar19;
    local_c8.d.size = (qsizetype)puVar4;
    if (&(local_c8.d.d)->super_QArrayData == (QArrayData *)0x0) goto switchD_005c3ca2_caseD_5;
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    pQVar6 = &((local_c8.d.d)->super_QArrayData).ref_;
    UNLOCK();
    pQVar20 = &(local_c8.d.d)->super_QArrayData;
    local_c8.d.d = (Data *)pQVar2;
    if ((pQVar6->_q_value).super___atomic_base<int>._M_i != 0) goto switchD_005c3ca2_caseD_5;
    goto LAB_005c3fad;
  case 4:
    if (this->m_htmlTagDepth == 0) {
      QTextCursor::insertHtml(&this->m_cursor,&local_c8);
      pQVar20 = &(local_c8.d.d)->super_QArrayData;
    }
    else {
      QString::append((QString *)&this->m_htmlAccumulator);
      pQVar20 = &(local_c8.d.d)->super_QArrayData;
    }
    break;
  default:
    goto switchD_005c3ca2_caseD_5;
  case 6:
    iVar14 = QString::indexOf((QRegularExpression *)&local_c8,0x80d0d8,
                              (QRegularExpressionMatch *)0x0);
    if (-1 < iVar14) {
      do {
        this->m_htmlTagDepth = this->m_htmlTagDepth + 1;
        iVar14 = QString::indexOf((QRegularExpression *)&local_c8,0x80d0d8,
                                  (QRegularExpressionMatch *)(ulong)(iVar14 + 2));
      } while (-1 < iVar14);
    }
    iVar14 = QString::indexOf((QRegularExpression *)&local_c8,0x80d0e8,
                              (QRegularExpressionMatch *)0x0);
    if (-1 < iVar14) {
      do {
        this->m_htmlTagDepth = this->m_htmlTagDepth + -1;
        iVar14 = QString::indexOf((QRegularExpression *)&local_c8,0x80d0e8,
                                  (QRegularExpressionMatch *)(ulong)(iVar14 + 2));
      } while (-1 < iVar14);
    }
    html = &this->m_htmlAccumulator;
    QString::append((QString *)html);
    pQVar20 = &(local_c8.d.d)->super_QArrayData;
    if (this->m_htmlTagDepth == 0) {
      lcMD();
      if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_68._0_4_ = 2;
        local_68._4_4_ = 0;
        local_68._8_4_ = 0;
        local_68._12_4_ = 0;
        local_68._16_4_ = 0;
        local_68._20_4_ = 0;
        pcStack_50 = (char16_t *)lcMD::category.name;
        QMessageLogger::debug();
        pDVar7 = local_f8.d.d;
        QVar22.m_data = (storage_type *)0x4;
        QVar22.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar22);
        QTextStream::operator<<((QTextStream *)pDVar7,(QString *)&local_88);
        if ((QTextFormatPrivate *)local_88.d.d != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)local_88.d.d = *(int *)local_88.d.d + -1;
          UNLOCK();
          if (*(int *)local_88.d.d == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(char *)&(((QFont *)((long)local_f8.d.d + 0x30))->d).d.ptr == '\x01') {
          QTextStream::operator<<((QTextStream *)local_f8.d.d,' ');
        }
        pcVar19 = (this->m_htmlAccumulator).d.ptr;
        if (pcVar19 == (char16_t *)0x0) {
          pcVar19 = (char16_t *)&QString::_empty;
        }
        QDebug::putString((QChar *)&local_f8,(ulong)pcVar19);
        if (*(char *)&(((QFont *)((long)local_f8.d.d + 0x30))->d).d.ptr == '\x01') {
          QTextStream::operator<<((QTextStream *)local_f8.d.d,' ');
        }
        QDebug::~QDebug((QDebug *)&local_f8);
      }
      QTextCursor::insertHtml(&this->m_cursor,html);
      if ((this->m_spanFormatStack).super_QList<QTextCharFormat>.d.size == 0) {
        QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_68);
        QTextCursor::setCharFormat(&this->m_cursor,(QTextCharFormat *)&local_68);
        QTextFormat::~QTextFormat((QTextFormat *)&local_68);
      }
      else {
        iVar16 = QList<QTextCharFormat>::end
                           (&(this->m_spanFormatStack).super_QList<QTextCharFormat>);
        QTextCursor::setCharFormat(&this->m_cursor,iVar16.i + -1);
      }
      pQVar2 = &((html->d).d)->super_QArrayData;
      (html->d).d = (Data *)0x0;
      (this->m_htmlAccumulator).d.ptr = (char16_t *)0x0;
      (this->m_htmlAccumulator).d.size = 0;
      pQVar20 = &(local_c8.d.d)->super_QArrayData;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
          pQVar20 = &(local_c8.d.d)->super_QArrayData;
        }
      }
    }
  }
  local_c8.d.size = 0;
  local_c8.d.ptr = (char16_t *)0x0;
  local_c8.d.d = (Data *)0x0;
  pQVar2 = &(local_c8.d.d)->super_QArrayData;
  if (pQVar20 != (QArrayData *)0x0) {
    LOCK();
    (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar20->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
LAB_005c3fad:
      QArrayData::deallocate(pQVar20,2,0x10);
      pQVar2 = &(local_c8.d.d)->super_QArrayData;
    }
  }
switchD_005c3ca2_caseD_5:
  local_c8.d.d = (Data *)pQVar2;
  pDVar7 = local_c8.d.d;
  if (this->m_blockType == 7) {
    if (((undefined1 *)local_c8.d.size == (undefined1 *)0x1) && (*local_c8.d.ptr == L'\n')) {
      this->m_needsInsertBlock = true;
      local_c8.d.d = (Data *)0x0;
      local_c8.d.ptr = (char16_t *)0x0;
      local_c8.d.size = 0;
      if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
        }
      }
    }
  }
  else if (this->m_blockType == 0xf) {
    local_68._0_4_ = this->m_tableCol;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&this->m_nonEmptyTableCells,(this->m_nonEmptyTableCells).d.size,
               (int *)local_68.data);
    QList<int>::end(&this->m_nonEmptyTableCells);
  }
  if (this->m_imageSpan == true) {
    this_00 = &this->m_imageFormat;
    ::QVariant::QVariant((QVariant *)&local_68,(QString *)&local_c8);
    QTextFormat::setProperty((QTextFormat *)this_00,0x5002,(QVariant *)&local_68);
    ::QVariant::~QVariant((QVariant *)&local_68);
    lcMD();
    if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_68._0_4_ = 2;
      local_68._4_4_ = 0;
      local_68._8_4_ = 0;
      local_68._12_4_ = 0;
      local_68._16_4_ = 0;
      local_68._20_4_ = 0;
      pcStack_50 = (char16_t *)lcMD::category.name;
      QMessageLogger::debug();
      uVar9 = local_98._0_8_;
      QVar23.m_data = &DAT_00000005;
      QVar23.m_size = (qsizetype)&local_88;
      QString::fromUtf8(QVar23);
      QTextStream::operator<<((QTextStream *)uVar9,(QString *)&local_88);
      if ((QTextFormatPrivate *)local_88.d.d != (QTextFormatPrivate *)0x0) {
        LOCK();
        *(int *)local_88.d.d = *(int *)local_88.d.d + -1;
        UNLOCK();
        if (*(int *)local_88.d.d == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(char *)&(((QTextCursorPrivate *)(local_98._0_8_ + 0x30))->super_QSharedData).ref.
                    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_98._0_8_,' ');
      }
      QTextFormat::stringProperty(&local_f8,(QTextFormat *)this_00,0x5000);
      pcVar19 = local_f8.d.ptr;
      if (local_f8.d.ptr == (char16_t *)0x0) {
        pcVar19 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)local_98,(ulong)pcVar19);
      if (*(char *)&(((QTextCursorPrivate *)(local_98._0_8_ + 0x30))->super_QSharedData).ref.
                    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_98._0_8_,' ');
      }
      uVar9 = local_98._0_8_;
      QVar24.m_data = &DAT_00000005;
      QVar24.m_size = (qsizetype)&local_88;
      QString::fromUtf8(QVar24);
      QTextStream::operator<<((QTextStream *)uVar9,(QString *)&local_88);
      if ((QTextFormatPrivate *)local_88.d.d != (QTextFormatPrivate *)0x0) {
        LOCK();
        *(int *)local_88.d.d = *(int *)local_88.d.d + -1;
        UNLOCK();
        if (*(int *)local_88.d.d == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(char *)&(((QTextCursorPrivate *)(local_98._0_8_ + 0x30))->super_QSharedData).ref.
                    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_98._0_8_,' ');
      }
      QTextFormat::stringProperty(&local_118,(QTextFormat *)this_00,0x5001);
      pcVar19 = local_118.d.ptr;
      if (local_118.d.ptr == (char16_t *)0x0) {
        pcVar19 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)local_98,(ulong)pcVar19);
      if (*(char *)&(((QTextCursorPrivate *)(local_98._0_8_ + 0x30))->super_QSharedData).ref.
                    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_98._0_8_,' ');
      }
      uVar9 = local_98._0_8_;
      QVar25.m_data = (storage_type *)0x3;
      QVar25.m_size = (qsizetype)&local_88;
      QString::fromUtf8(QVar25);
      QTextStream::operator<<((QTextStream *)uVar9,(QString *)&local_88);
      if ((QTextFormatPrivate *)local_88.d.d != (QTextFormatPrivate *)0x0) {
        LOCK();
        *(int *)local_88.d.d = *(int *)local_88.d.d + -1;
        UNLOCK();
        if (*(int *)local_88.d.d == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(char *)&(((QTextCursorPrivate *)(local_98._0_8_ + 0x30))->super_QSharedData).ref.
                    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_98._0_8_,' ');
      }
      pcVar19 = local_c8.d.ptr;
      if (local_c8.d.ptr == (char16_t *)0x0) {
        pcVar19 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)local_98,(ulong)pcVar19);
      if (*(char *)&(((QTextCursorPrivate *)(local_98._0_8_ + 0x30))->super_QSharedData).ref.
                    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_98._0_8_,' ');
      }
      uVar9 = local_98._0_8_;
      QVar26.m_data = (storage_type *)0xb;
      QVar26.m_size = (qsizetype)&local_88;
      QString::fromUtf8(QVar26);
      QTextStream::operator<<((QTextStream *)uVar9,(QString *)&local_88);
      if ((QTextFormatPrivate *)local_88.d.d != (QTextFormatPrivate *)0x0) {
        LOCK();
        *(int *)local_88.d.d = *(int *)local_88.d.d + -1;
        UNLOCK();
        if (*(int *)local_88.d.d == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(char *)&(((QTextCursorPrivate *)(local_98._0_8_ + 0x30))->super_QSharedData).ref.
                    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_98._0_8_,' ');
      }
      local_d8.d.ptr =
           (totally_ordered_wrapper<QTextCursorPrivate_*>)
           (totally_ordered_wrapper<QTextCursorPrivate_*>)local_98._0_8_;
      *(int *)(local_98._0_8_ + 0x28) = *(int *)(local_98._0_8_ + 0x28) + 1;
      QTextCursor::document(&this->m_cursor);
      QTextDocument::baseUrl((QTextDocument *)&local_88);
      ::operator<<((QDebug *)&local_d0,(QUrl *)&local_d8);
      QDebug::~QDebug(&local_d0);
      QUrl::~QUrl((QUrl *)&local_88);
      QDebug::~QDebug((QDebug *)&local_d8);
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QTextFormatPrivate *)local_f8.d.d != (QTextFormatPrivate *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDebug::~QDebug((QDebug *)local_98);
    }
    QTextCursor::insertImage(&this->m_cursor,this_00);
  }
  else {
    if ((undefined1 *)local_c8.d.size != (undefined1 *)0x0) {
      QTextCursor::insertText(&this->m_cursor,&local_c8);
    }
    pQVar17 = QTextCursor::currentList(&this->m_cursor);
    if (pQVar17 != (QTextList *)0x0) {
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::blockFormat((QTextCursor *)&local_88);
      ::QVariant::QVariant((QVariant *)&local_68,0);
      QTextFormat::setProperty((QTextFormat *)&local_88,0x1040,(QVariant *)&local_68);
      ::QVariant::~QVariant((QVariant *)&local_68);
      QTextCursor::setBlockFormat(&this->m_cursor,(QTextBlockFormat *)&local_88);
      QTextFormat::~QTextFormat((QTextFormat *)&local_88);
    }
    lcMD();
    cVar12 = QLoggingCategory::isEnabled(0x80d0f8);
    if (cVar12 != '\0') {
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::blockFormat((QTextCursor *)local_98);
      local_f8.d.d = (Data *)0x0;
      local_f8.d.ptr = (char16_t *)0x0;
      local_f8.d.size = 0;
      pQVar17 = QTextCursor::currentList(&this->m_cursor);
      if (pQVar17 != (QTextList *)0x0) {
        QTextCursor::currentList(&this->m_cursor);
        QTextList::format((QTextList *)&local_a8);
        iVar14 = QTextFormat::intProperty(&local_a8,0x3001);
        QString::number((int)&local_118,iVar14);
        local_48 = local_118.d.size;
        pcStack_50 = local_118.d.ptr;
        pDVar7 = local_118.d.d;
        local_68._0_4_ = 0x11;
        local_68._4_4_ = 0;
        local_68._8_4_ = 0x6bf921;
        local_68._12_4_ = 0;
        local_118.d.d = (Data *)0x0;
        local_118.d.ptr = (char16_t *)0x0;
        local_68._16_4_ = SUB84(pDVar7,0);
        local_68._20_4_ = (undefined4)((ulong)pDVar7 >> 0x20);
        local_118.d.size = 0;
        QStringBuilder<QLatin1String,_QString>::convertTo<QString>
                  (&local_88,(QStringBuilder<QLatin1String,_QString> *)&local_68);
        qVar11 = local_88.d.size;
        pDVar10 = local_88.d.d;
        pcVar19 = local_f8.d.ptr;
        pDVar7 = local_f8.d.d;
        local_88.d.d = local_f8.d.d;
        local_f8.d.d = pDVar10;
        local_f8.d.ptr = local_88.d.ptr;
        local_88.d.ptr = pcVar19;
        local_88.d.size = local_f8.d.size;
        local_f8.d.size = qVar11;
        if ((QTextFormatPrivate *)pDVar7 != (QTextFormatPrivate *)0x0) {
          LOCK();
          (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
          }
        }
        piVar5 = (int *)CONCAT44(local_68._20_4_,local_68._16_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_68._20_4_,local_68._16_4_),2,0x10);
          }
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
        QTextFormat::~QTextFormat(&local_a8);
      }
      bVar13 = QTextFormat::hasProperty((QTextFormat *)local_98,0x1080);
      if (bVar13) {
        iVar14 = QTextFormat::intProperty((QTextFormat *)local_98,0x1080);
        QString::number((int)&local_88,iVar14);
        local_48 = local_88.d.size;
        pcStack_50 = local_88.d.ptr;
        pDVar7 = local_88.d.d;
        local_68._0_4_ = 0x17;
        local_68._4_4_ = 0;
        local_68._8_4_ = 0x6bf933;
        local_68._12_4_ = 0;
        local_88.d.d = (Data *)0x0;
        local_88.d.ptr = (char16_t *)0x0;
        local_68._16_4_ = SUB84(pDVar7,0);
        local_68._20_4_ = (undefined4)((ulong)pDVar7 >> 0x20);
        local_88.d.size = 0;
        ::operator+=(&local_f8,(QStringBuilder<QLatin1String,_QString> *)&local_68);
        piVar5 = (int *)CONCAT44(local_68._20_4_,local_68._16_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_68._20_4_,local_68._16_4_),2,0x10);
          }
        }
        if ((QTextFormatPrivate *)local_88.d.d != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)local_88.d.d = *(int *)local_88.d.d + -1;
          UNLOCK();
          if (*(int *)local_88.d.d == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      bVar13 = QTextFormat::hasProperty((QTextFormat *)local_98,0x1090);
      if (bVar13) {
        QVar27.m_data = (char *)0xf;
        QVar27.m_size = (qsizetype)&local_f8;
        QString::append(QVar27);
      }
      lcMD();
      if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_68._0_4_ = 2;
        local_68._4_4_ = 0;
        local_68._8_4_ = 0;
        local_68._12_4_ = 0;
        local_68._16_4_ = 0;
        local_68._20_4_ = 0;
        pcStack_50 = (char16_t *)lcMD::category.name;
        QMessageLogger::debug();
        QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,textType);
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        QVar8.d.ptr = local_a8.d.d.ptr;
        QVar28.m_data = &DAT_00000008;
        QVar28.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar28);
        QTextStream::operator<<((QTextStream *)QVar8.d.ptr,(QString *)&local_88);
        if ((QTextFormatPrivate *)local_88.d.d != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)local_88.d.d = *(int *)local_88.d.d + -1;
          UNLOCK();
          if (*(int *)local_88.d.d == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,this->m_blockType);
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        pcVar19 = local_c8.d.ptr;
        if (local_c8.d.ptr == (char16_t *)0x0) {
          pcVar19 = (char16_t *)&QString::_empty;
        }
        QDebug::putString((QChar *)&local_a8,(ulong)pcVar19);
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        QString::toLocal8Bit_helper((QChar *)&local_118,(longlong)local_f8.d.ptr);
        QVar8.d.ptr = local_a8.d.d.ptr;
        pcVar19 = local_118.d.ptr;
        if (local_118.d.ptr == (char16_t *)0x0) {
          pcVar19 = (char16_t *)&QByteArray::_empty;
        }
        psVar15 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar1 = (char *)((long)pcVar19 + 1) + (long)psVar15;
          psVar15 = psVar15 + 1;
        } while (*pcVar1 != '\0');
        QVar29.m_data = psVar15;
        QVar29.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar29);
        QTextStream::operator<<((QTextStream *)QVar8.d.ptr,(QString *)&local_88);
        if ((QTextFormatPrivate *)local_88.d.d != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)local_88.d.d = *(int *)local_88.d.d + -1;
          UNLOCK();
          if (*(int *)local_88.d.d == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        QVar8.d.ptr = local_a8.d.d.ptr;
        QVar30.m_data = (storage_type *)0x7;
        QVar30.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar30);
        QTextStream::operator<<((QTextStream *)QVar8.d.ptr,(QString *)&local_88);
        if ((QTextFormatPrivate *)local_88.d.d != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)local_88.d.d = *(int *)local_88.d.d + -1;
          UNLOCK();
          if (*(int *)local_88.d.d == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        iVar14 = QTextFormat::intProperty((QTextFormat *)local_98,0x1040);
        QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,iVar14);
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        QVar8.d.ptr = local_a8.d.d.ptr;
        QVar31.m_data = (storage_type *)0x7;
        QVar31.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar31);
        QTextStream::operator<<((QTextStream *)QVar8.d.ptr,(QString *)&local_88);
        if ((QTextFormatPrivate *)local_88.d.d != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)local_88.d.d = *(int *)local_88.d.d + -1;
          UNLOCK();
          if (*(int *)local_88.d.d == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        qVar3 = QTextFormat::doubleProperty((QTextFormat *)local_98,0x1034);
        QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,qVar3);
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        QVar8.d.ptr = local_a8.d.d.ptr;
        QVar32.m_data = (storage_type *)0x7;
        QVar32.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar32);
        QTextStream::operator<<((QTextStream *)QVar8.d.ptr,(QString *)&local_88);
        if ((QTextFormatPrivate *)local_88.d.d != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)local_88.d.d = *(int *)local_88.d.d + -1;
          UNLOCK();
          if (*(int *)local_88.d.d == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        qVar3 = QTextFormat::doubleProperty((QTextFormat *)local_98,0x1032);
        QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,qVar3);
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        qVar3 = QTextFormat::doubleProperty((QTextFormat *)local_98,0x1030);
        QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,qVar3);
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        qVar3 = QTextFormat::doubleProperty((QTextFormat *)local_98,0x1031);
        QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,qVar3);
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        qVar3 = QTextFormat::doubleProperty((QTextFormat *)local_98,0x1033);
        QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,qVar3);
        if (*(QTextStream *)((long)local_a8.d.d.ptr + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8.d.d.ptr,' ');
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,1,0x10);
          }
        }
        QDebug::~QDebug((QDebug *)&local_a8);
      }
      if ((QTextFormatPrivate *)local_f8.d.d != (QTextFormatPrivate *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QTextFormat::~QTextFormat((QTextFormat *)local_98);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int QTextMarkdownImporter::cbText(int textType, const char *text, unsigned size)
{
    if (m_needsInsertBlock)
        insertBlock();
#if QT_CONFIG(regularexpression)
    static const QRegularExpression openingBracket(QStringLiteral("<[a-zA-Z]"));
    static const QRegularExpression closingBracket(QStringLiteral("(/>|</)"));
#endif
    QString s = QString::fromUtf8(text, int(size));

    switch (textType) {
    case MD_TEXT_NORMAL:
#if QT_CONFIG(regularexpression)
        if (m_htmlTagDepth) {
            m_htmlAccumulator += s;
            s = QString();
        }
#endif
        break;
    case MD_TEXT_NULLCHAR:
        s = QString(QChar(u'\xFFFD')); // CommonMark-required replacement for null
        break;
    case MD_TEXT_BR:
        s = QString(qtmi_Newline);
        break;
    case MD_TEXT_SOFTBR:
        s = QString(qtmi_Space);
        break;
    case MD_TEXT_CODE:
        // We'll see MD_SPAN_CODE too, which will set the char format, and that's enough.
        break;
#if QT_CONFIG(texthtmlparser)
    case MD_TEXT_ENTITY:
        if (m_htmlTagDepth)
            m_htmlAccumulator += s;
        else
            m_cursor.insertHtml(s);
        s = QString();
        break;
#endif
    case MD_TEXT_HTML:
        // count how many tags are opened and how many are closed
#if QT_CONFIG(regularexpression) && QT_CONFIG(texthtmlparser)
        {
            int startIdx = 0;
            while ((startIdx = s.indexOf(openingBracket, startIdx)) >= 0) {
                ++m_htmlTagDepth;
                startIdx += 2;
            }
            startIdx = 0;
            while ((startIdx = s.indexOf(closingBracket, startIdx)) >= 0) {
                --m_htmlTagDepth;
                startIdx += 2;
            }
        }
        m_htmlAccumulator += s;
        if (!m_htmlTagDepth) { // all open tags are now closed
            qCDebug(lcMD) << "HTML" << m_htmlAccumulator;
            m_cursor.insertHtml(m_htmlAccumulator);
            if (m_spanFormatStack.isEmpty())
                m_cursor.setCharFormat(QTextCharFormat());
            else
                m_cursor.setCharFormat(m_spanFormatStack.top());
            m_htmlAccumulator = QString();
        }
#endif
        s = QString();
        break;
    }

    switch (m_blockType) {
    case MD_BLOCK_TD:
        m_nonEmptyTableCells.append(m_tableCol);
        break;
    case MD_BLOCK_CODE:
        if (s == qtmi_Newline) {
            // defer a blank line until we see something else in the code block,
            // to avoid ending every code block with a gratuitous blank line
            m_needsInsertBlock = true;
            s = QString();
        }
        break;
    default:
        break;
    }

    if (m_imageSpan) {
        // TODO we don't yet support alt text with formatting, because of the cases where m_cursor
        // already inserted the text above.  Rather need to accumulate it in case we need it here.
        m_imageFormat.setProperty(QTextFormat::ImageAltText, s);
        qCDebug(lcMD) << "image" << m_imageFormat.name()
                      << "title" << m_imageFormat.stringProperty(QTextFormat::ImageTitle)
                      << "alt" << s << "relative to" << m_cursor.document()->baseUrl();
        m_cursor.insertImage(m_imageFormat);
        return 0; // no error
    }

    if (!s.isEmpty())
        m_cursor.insertText(s);
    if (m_cursor.currentList()) {
        // The list item will indent the list item's text, so we don't need indentation on the block.
        QTextBlockFormat bfmt = m_cursor.blockFormat();
        bfmt.setIndent(0);
        m_cursor.setBlockFormat(bfmt);
    }
    if (lcMD().isEnabled(QtDebugMsg)) {
        QTextBlockFormat bfmt = m_cursor.blockFormat();
        QString debugInfo;
        if (m_cursor.currentList())
            debugInfo = "in list at depth "_L1 + QString::number(m_cursor.currentList()->format().indent());
        if (bfmt.hasProperty(QTextFormat::BlockQuoteLevel))
            debugInfo += "in blockquote at depth "_L1 +
                    QString::number(bfmt.intProperty(QTextFormat::BlockQuoteLevel));
        if (bfmt.hasProperty(QTextFormat::BlockCodeLanguage))
            debugInfo += "in a code block"_L1;
        qCDebug(lcMD) << textType << "in block" << m_blockType << s << qPrintable(debugInfo)
                      << "bindent" << bfmt.indent() << "tindent" << bfmt.textIndent()
                      << "margins" << bfmt.leftMargin() << bfmt.topMargin() << bfmt.bottomMargin() << bfmt.rightMargin();
    }
    return 0; // no error
}